

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O0

ssize_t __thiscall
blc::network::SSLSocket::read_abi_cxx11_(SSLSocket *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int ret;
  char tmp;
  string *str;
  string *in_stack_00000108;
  exception *in_stack_00000110;
  SSLSocket *__s;
  int local_84;
  duration<double,std::ratio<1l,1000l>> local_80 [13];
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_4d;
  int local_18;
  char local_12 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  SSLSocket *local_8;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(in_register_00000034,__fd);
  local_12[1] = 0;
  __s = this;
  local_10 = this_00;
  local_8 = this;
  std::__cxx11::string::string((string *)this);
  if ((this_00[3].field_2._M_local_buf[8] & 1U) == 0) {
    local_4d = 1;
    uVar1 = __cxa_allocate_exception(0x78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,(allocator<char> *)this);
    error::exception::exception(in_stack_00000110,in_stack_00000108);
    local_4d = 0;
    __cxa_throw(uVar1,&error::exception::typeinfo,error::exception::~exception);
  }
  while( true ) {
    local_18 = SSL_read(*(SSL **)(this_00 + 4),local_12,1);
    if (local_18 < 1) {
      return (ssize_t)__s;
    }
    if (local_18 == -1) {
      local_73 = 1;
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pvVar3 = operator_new(0x78);
      local_72 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)__s,(allocator<char> *)this);
      error::exception::exception(in_stack_00000110,in_stack_00000108);
      local_72 = 0;
      *puVar2 = pvVar3;
      local_73 = 0;
      __cxa_throw(puVar2,&error::exception*::typeinfo,0);
    }
    if (local_12[0] == '\n') {
      return (ssize_t)__s;
    }
    if (local_12[0] == '\0') break;
    std::__cxx11::string::operator+=((string *)this,local_12[0]);
    local_84 = 1;
    std::chrono::duration<double,std::ratio<1l,1000l>>::duration<int,void>(local_80,&local_84);
    std::this_thread::sleep_for<double,std::ratio<1l,1000l>>
              ((duration<double,_std::ratio<1L,_1000L>_> *)this);
  }
  return (ssize_t)__s;
}

Assistant:

std::string blc::network::SSLSocket::read() const {
	std::string	str;
	char		tmp;
	int		ret;

	if (this->_opened == false)
		throw blc::error::exception("not opened");
	while ((ret = SSL_read(this->_ssl, &tmp, 1)) > 0) {
		if (ret == -1)
			throw new blc::error::exception("read error");
		if (tmp == '\n' || tmp == '\0')
			break;
		str += tmp;
		std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(1));
	}
	return (str);
}